

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureDataManager.cpp
# Opt level: O0

bool __thiscall SecureDataManager::setSOPIN(SecureDataManager *this,ByteString *soPIN)

{
  size_t sVar1;
  long in_RDI;
  ByteString key;
  ByteString *in_stack_00000128;
  ByteString *in_stack_00000130;
  SecureDataManager *in_stack_00000138;
  ByteString *in_stack_ffffffffffffff98;
  SecureDataManager *this_00;
  undefined1 local_40 [63];
  bool local_1;
  
  sVar1 = ByteString::size((ByteString *)0x1c8642);
  if (sVar1 == 0) {
    softHSMLog(7,"setSOPIN",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/SecureDataManager.cpp"
               ,0xc4,"Zero length PIN specified");
    local_1 = false;
  }
  else {
    sVar1 = ByteString::size((ByteString *)0x1c8686);
    if ((sVar1 == 0) || ((*(byte *)(in_RDI + 0x58) & 1) != 0)) {
      sVar1 = ByteString::size((ByteString *)0x1c86d5);
      if (sVar1 == 0) {
        this_00 = (SecureDataManager *)local_40;
        ByteString::ByteString((ByteString *)0x1c86ea);
        (**(code **)(**(long **)(in_RDI + 0xb8) + 0x10))(*(long **)(in_RDI + 0xb8),this_00,0x20);
        remask(this_00,in_stack_ffffffffffffff98);
        ByteString::~ByteString((ByteString *)0x1c8726);
      }
      local_1 = pbeEncryptKey(in_stack_00000138,in_stack_00000130,in_stack_00000128);
    }
    else {
      softHSMLog(7,"setSOPIN",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/SecureDataManager.cpp"
                 ,0xcc,"SO must be logged in to change the SO PIN");
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool SecureDataManager::setSOPIN(const ByteString& soPIN)
{
	// Check the new PIN
	if (soPIN.size() == 0)
	{
		DEBUG_MSG("Zero length PIN specified");

		return false;
	}

	// Check if the SO needs to be logged in
	if ((soEncryptedKey.size() > 0) && !soLoggedIn)
	{
		DEBUG_MSG("SO must be logged in to change the SO PIN");

		return false;
	}

	// If no SO PIN was set, then this is a SecureDataManager for a blank token. This
	// means a new key has to be generated
	if (soEncryptedKey.size() == 0)
	{
		ByteString key;

		rng->generateRandom(key, 32);

		remask(key);
	}

	return pbeEncryptKey(soPIN, soEncryptedKey);
}